

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist_sort.c
# Opt level: O2

void linkedlist_sort(s_linkedlist *linked_list,f_comparator comparator)

{
  s_linkedlist_node *psVar1;
  void *pvVar2;
  int iVar3;
  bool bVar4;
  s_linkedlist_node **ppsVar5;
  s_linkedlist_node *psVar6;
  
  psVar6 = (s_linkedlist_node *)0x0;
  do {
    bVar4 = true;
    ppsVar5 = &linked_list->head;
    while( true ) {
      psVar1 = *ppsVar5;
      if (psVar1->next == psVar6) break;
      ppsVar5 = &psVar1->next;
      iVar3 = (*comparator)(psVar1->element,psVar1->next->element);
      if (0 < iVar3) {
        pvVar2 = psVar1->element;
        psVar1->element = psVar1->next->element;
        psVar1->next->element = pvVar2;
        bVar4 = false;
      }
    }
    psVar6 = psVar1;
  } while (!bVar4);
  return;
}

Assistant:

void linkedlist_sort(s_linkedlist *linked_list, f_comparator comparator) {
    s_linkedlist_node *node   = NULL;
    s_linkedlist_node *lptr   = NULL;
    int               swapped = 0;

    do {
        node    = linked_list->head;
        swapped = 0;

        while (node->next != lptr) {
            if (comparator(node->element, node->next->element) > 0) {
                linkedlistnode_swap(node, node->next);
                swapped = 1;
            }

            node = node->next;
        }

        lptr = node;
    } while (swapped);
}